

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall
libtorrent::storage_moved_failed_alert::~storage_moved_failed_alert
          (storage_moved_failed_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var2 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT storage_moved_failed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT storage_moved_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, error_code const& e, string_view file
			, operation_t op);

		TORRENT_DEFINE_ALERT_PRIO(storage_moved_failed_alert, 34, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		error_code const error;

		// If the error happened for a specific file, this returns its path.
		char const* file_path() const;

		// this indicates what underlying operation caused the error
		operation_t op;
	private:
		aux::allocation_slot m_file_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		TORRENT_DEPRECATED char const* operation;
		// If the error happened for a specific file, ``file`` is its path.
		TORRENT_DEPRECATED std::string file;
#endif
	}